

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O3

VariableIndex __thiscall
dynet::ComputationGraph::add_function<dynet::SumElements>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments)

{
  iterator __position;
  Node *pNVar1;
  pointer ppNVar2;
  Device **ppDVar3;
  VariableIndex new_node_index;
  allocator_type local_25;
  VariableIndex local_24;
  Node *local_20;
  
  local_24 = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pNVar1 = (Node *)operator_new(0x60);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_005b4008;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&pNVar1->args,*arguments,&local_25);
  (pNVar1->dim).nd = 0;
  (pNVar1->dim).bd = 1;
  pNVar1->device = (Device *)0x0;
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_005b5460;
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20 = pNVar1;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,&local_20);
    ppNVar2 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = pNVar1;
    ppNVar2 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar2;
  }
  if (ppNVar2[-1]->device == (Device *)0x0) {
    if (arguments->_M_len == 0) {
      ppDVar3 = (Device **)&dynet::default_device;
    }
    else {
      ppDVar3 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[*arguments->_M_array]->device;
    }
    ppNVar2[-1]->device = *ppDVar3;
  }
  set_dim_for_new_node(this,&local_24);
  return local_24;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}